

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix33<float> * __thiscall
Imath_3_2::Matrix33<float>::inverse
          (Matrix33<float> *__return_storage_ptr__,Matrix33<float> *this,bool singExc)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Matrix33<float> *pMVar5;
  Matrix33<float> *pMVar6;
  Matrix33<float> *pMVar7;
  Matrix33<float> *pMVar8;
  invalid_argument *this_00;
  int i;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  Matrix33<float> local_38;
  
  pMVar5 = &local_38;
  pMVar6 = &local_38;
  pMVar7 = &local_38;
  pMVar8 = &local_38;
  fVar12 = this->x[0][2];
  if ((fVar12 != 0.0) || (NAN(fVar12))) {
    fVar11 = this->x[1][2];
  }
  else {
    fVar11 = this->x[1][2];
    if ((((fVar11 == 0.0) && (!NAN(fVar11))) && (fVar1 = this->x[2][2], fVar1 == 1.0)) &&
       (!NAN(fVar1))) {
      local_38.x[0][0] = this->x[1][1];
      local_38.x[1][1] = this->x[0][0];
      fVar12 = this->x[0][1];
      fVar11 = this->x[1][0];
      local_38.x[0][1] = -fVar12;
      local_38.x[0][2] = 0.0;
      local_38.x[1][0] = -fVar11;
      local_38.x[1][2] = 0.0;
      local_38.x[2][0] = 0.0;
      local_38.x[2][1] = 0.0;
      local_38.x[2][2] = 1.0;
      fVar11 = local_38.x[1][1] * local_38.x[0][0] - fVar12 * fVar11;
      fVar12 = fVar11;
      if (fVar11 <= -fVar11) {
        fVar12 = -fVar11;
      }
      if (1.0 <= fVar12) {
        for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
          for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
            *(float *)((long)pMVar8 + lVar10 * 4) = *(float *)((long)pMVar8 + lVar10 * 4) / fVar11;
          }
          pMVar8 = (Matrix33<float> *)((long)pMVar8 + 0xc);
        }
      }
      else {
        for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
          for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
            fVar1 = *(float *)((long)pMVar7 + lVar10 * 4);
            fVar15 = fVar1;
            if (fVar1 <= -fVar1) {
              fVar15 = -fVar1;
            }
            if (fVar12 * 8.507059e+37 <= fVar15) {
              if (!singExc) goto LAB_001380c1;
              this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(this_00,"Cannot invert singular matrix.");
              goto LAB_00138237;
            }
            *(float *)((long)pMVar7 + lVar10 * 4) = fVar1 / fVar11;
          }
          pMVar7 = (Matrix33<float> *)((long)pMVar7 + 0xc);
        }
      }
      fVar12 = this->x[2][0];
      fVar11 = this->x[2][1];
      local_38.x[2][0] = -fVar12 * local_38.x[0][0] - fVar11 * local_38.x[1][0];
      local_38.x[2][1] = -fVar12 * local_38.x[0][1] - fVar11 * local_38.x[1][1];
      goto LAB_001380b2;
    }
  }
  uVar3 = *(undefined8 *)(this->x[2] + 1);
  fVar1 = this->x[0][1];
  uVar4 = *(undefined8 *)this->x[1];
  fVar16 = (float)uVar4;
  fVar17 = (float)((ulong)uVar4 >> 0x20);
  fVar13 = (float)uVar3;
  fVar14 = (float)((ulong)uVar3 >> 0x20);
  fVar15 = this->x[2][0];
  fVar2 = this->x[0][0];
  local_38.x[0][0] = fVar17 * fVar14 - fVar11 * fVar13;
  local_38.x[1][0] = fVar11 * fVar15 - fVar14 * fVar16;
  local_38.x[0][1] = fVar12 * fVar13 - fVar14 * fVar1;
  local_38.x[0][2] = fVar11 * fVar1 - fVar12 * fVar17;
  local_38.x[2][0] = fVar16 * fVar13 - fVar17 * fVar15;
  local_38.x[1][1] = fVar2 * fVar14 - fVar12 * fVar15;
  local_38.x[1][2] = fVar12 * fVar16 - fVar11 * fVar2;
  local_38.x[2][1] = fVar1 * fVar15 - fVar13 * fVar2;
  local_38.x[2][2] = fVar17 * fVar2 + -fVar16 * fVar1;
  fVar11 = local_38.x[2][0] * fVar12 + local_38.x[1][0] * fVar1 + fVar2 * local_38.x[0][0];
  fVar12 = fVar11;
  if (fVar11 <= -fVar11) {
    fVar12 = -fVar11;
  }
  if (1.0 <= fVar12) {
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        *(float *)((long)pMVar6 + lVar10 * 4) = *(float *)((long)pMVar6 + lVar10 * 4) / fVar11;
      }
      pMVar6 = (Matrix33<float> *)((long)pMVar6 + 0xc);
    }
  }
  else {
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        fVar1 = *(float *)((long)pMVar5 + lVar10 * 4);
        fVar15 = fVar1;
        if (fVar1 <= -fVar1) {
          fVar15 = -fVar1;
        }
        if (fVar12 * 8.507059e+37 <= fVar15) {
          if (!singExc) {
LAB_001380c1:
            Matrix33(__return_storage_ptr__);
            return __return_storage_ptr__;
          }
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(this_00,"Cannot invert singular matrix.");
LAB_00138237:
          __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        *(float *)((long)pMVar5 + lVar10 * 4) = fVar1 / fVar11;
      }
      pMVar5 = (Matrix33<float> *)((long)pMVar5 + 0xc);
    }
  }
LAB_001380b2:
  Matrix33(__return_storage_ptr__,&local_38);
  return __return_storage_ptr__;
}

Assistant:

IMATH_CONSTEXPR14 inline Matrix33<T>
Matrix33<T>::inverse (bool singExc) const
{
    if (x[0][2] != 0 || x[1][2] != 0 || x[2][2] != 1)
    {
        Matrix33 s (
            x[1][1] * x[2][2] - x[2][1] * x[1][2],
            x[2][1] * x[0][2] - x[0][1] * x[2][2],
            x[0][1] * x[1][2] - x[1][1] * x[0][2],

            x[2][0] * x[1][2] - x[1][0] * x[2][2],
            x[0][0] * x[2][2] - x[2][0] * x[0][2],
            x[1][0] * x[0][2] - x[0][0] * x[1][2],

            x[1][0] * x[2][1] - x[2][0] * x[1][1],
            x[2][0] * x[0][1] - x[0][0] * x[2][1],
            x[0][0] * x[1][1] - x[1][0] * x[0][1]);

        T r = x[0][0] * s[0][0] + x[0][1] * s[1][0] + x[0][2] * s[2][0];

        if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
        {
            for (int i = 0; i < 3; ++i)
            {
                for (int j = 0; j < 3; ++j)
                {
                    s.x[i][j] /= r;
                }
            }
        }
        else
        {
            T mr = IMATH_INTERNAL_NAMESPACE::abs (r) /
                   std::numeric_limits<T>::min ();

            for (int i = 0; i < 3; ++i)
            {
                for (int j = 0; j < 3; ++j)
                {
                    if (mr > IMATH_INTERNAL_NAMESPACE::abs (s.x[i][j]))
                    {
                        s.x[i][j] /= r;
                    }
                    else
                    {
                        if (singExc)
                            throw std::invalid_argument ("Cannot invert "
                                                         "singular matrix.");
                        return Matrix33 ();
                    }
                }
            }
        }

        return s;
    }
    else
    {
        Matrix33 s (
            x[1][1],
            -x[0][1],
            0,

            -x[1][0],
            x[0][0],
            0,

            0,
            0,
            1);

        T r = x[0][0] * x[1][1] - x[1][0] * x[0][1];

        if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
        {
            for (int i = 0; i < 2; ++i)
            {
                for (int j = 0; j < 2; ++j)
                {
                    s.x[i][j] /= r;
                }
            }
        }
        else
        {
            T mr = IMATH_INTERNAL_NAMESPACE::abs (r) /
                   std::numeric_limits<T>::min ();

            for (int i = 0; i < 2; ++i)
            {
                for (int j = 0; j < 2; ++j)
                {
                    if (mr > IMATH_INTERNAL_NAMESPACE::abs (s.x[i][j]))
                    {
                        s.x[i][j] /= r;
                    }
                    else
                    {
                        if (singExc)
                            throw std::invalid_argument ("Cannot invert "
                                                         "singular matrix.");
                        return Matrix33 ();
                    }
                }
            }
        }

        s.x[2][0] = -x[2][0] * s.x[0][0] - x[2][1] * s.x[1][0];
        s.x[2][1] = -x[2][0] * s.x[0][1] - x[2][1] * s.x[1][1];

        return s;
    }
}